

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O0

Index __thiscall
Eigen::RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::findSmallSubdiagEntry
          (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this,Index iu)

{
  PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_RSI;
  int in_EDI;
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  Real RVar2;
  Scalar s;
  Index res;
  double in_stack_ffffffffffffffe0;
  PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this_00;
  
  this_00 = in_RSI;
  while( true ) {
    if ((long)in_RSI < 1) {
      return (Index)in_RSI;
    }
    iVar1 = in_EDI;
    PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
              (this_00,(Index)in_RSI,(Index)in_stack_ffffffffffffffe0);
    std::abs(iVar1);
    iVar1 = in_EDI;
    PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
              (this_00,(Index)in_RSI,(Index)in_stack_ffffffffffffffe0);
    std::abs(iVar1);
    in_stack_ffffffffffffffe0 = extraout_XMM0_Qa + extraout_XMM0_Qa_00;
    iVar1 = in_EDI;
    PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
              (this_00,(Index)in_RSI,(Index)in_stack_ffffffffffffffe0);
    std::abs(iVar1);
    RVar2 = GenericNumTraits<double>::epsilon();
    if (extraout_XMM0_Qa_01 <= RVar2 * in_stack_ffffffffffffffe0) break;
    in_RSI = (PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
             ((long)in_RSI[-1].m_storage.m_data.array + 0x1f);
  }
  return (Index)in_RSI;
}

Assistant:

inline typename MatrixType::Index RealSchur<MatrixType>::findSmallSubdiagEntry(Index iu)
{
  using std::abs;
  Index res = iu;
  while (res > 0)
  {
    Scalar s = abs(m_matT.coeff(res-1,res-1)) + abs(m_matT.coeff(res,res));
    if (abs(m_matT.coeff(res,res-1)) <= NumTraits<Scalar>::epsilon() * s)
      break;
    res--;
  }
  return res;
}